

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>
     *this,int i)

{
  double *pdVar1;
  undefined4 in_ESI;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_> *in_RDI
  ;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  vVar2 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
          ::dx(in_RDI,in_stack_ffffffffffffffdc);
  pdVar1 = Fad<double>::dx((Fad<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           (int)((ulong)vVar2 >> 0x20));
  return vVar2 - *pdVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}